

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

Maybe<kj::Exception> * __thiscall
kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1584::run()::__1>
          (Maybe<kj::Exception> *__return_storage_ptr__,kj *this,anon_class_8_1_c2acc87d *func)

{
  anon_class_8_1_c2acc87d *func_local;
  
  capnp::_::anon_unknown_0::TestCase1584::run::anon_class_8_1_c2acc87d::operator()
            ((anon_class_8_1_c2acc87d *)this);
  Maybe<kj::Exception>::Maybe(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Maybe<Exception> runCatchingExceptions(Func&& func) {
  try {
    func();
    return kj::none;
  } catch (...) {
    return getCaughtExceptionAsKj();
  }
}